

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  RESULT_TYPE RVar10;
  RESULT_TYPE RVar11;
  
  RVar10 = QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
           ::operator()(this->accessor_l,lhs);
  lVar3 = RVar10.micros;
  RVar11 = QuantileComposed<duckdb::MadAccessor<duckdb::dtime_t,_duckdb::interval_t,_duckdb::dtime_t>,_duckdb::QuantileIndirect<duckdb::dtime_t>_>
           ::operator()(this->accessor_r,rhs);
  lVar5 = RVar11.micros;
  lVar4 = RVar10._0_8_ >> 0x20;
  lVar6 = RVar11._0_8_ >> 0x20;
  if (this->desc == true) {
    lVar4 = lVar4 + lVar3 / 86400000000;
    lVar7 = (long)RVar10.months + lVar4 / 0x1e;
    lVar6 = lVar6 + lVar5 / 86400000000;
    lVar2 = (long)RVar11.months + lVar6 / 0x1e;
    if (lVar2 < lVar7) {
      return true;
    }
    if (lVar7 < lVar2) {
      return false;
    }
    lVar3 = lVar3 % 86400000000;
    lVar4 = lVar4 % 0x1e;
    lVar5 = lVar5 % 86400000000;
    lVar6 = lVar6 % 0x1e;
    if (lVar6 < lVar4) {
      return true;
    }
    bVar1 = lVar6 <= lVar4;
    bVar9 = SBORROW8(lVar3,lVar5);
    lVar6 = lVar3 - lVar5;
    bVar8 = lVar3 == lVar5;
  }
  else {
    lVar6 = lVar6 + lVar5 / 86400000000;
    lVar2 = (long)RVar11.months + lVar6 / 0x1e;
    lVar4 = lVar4 + lVar3 / 86400000000;
    lVar7 = (long)RVar10.months + lVar4 / 0x1e;
    if (lVar7 < lVar2) {
      return true;
    }
    if (lVar2 < lVar7) {
      return false;
    }
    lVar5 = lVar5 % 86400000000;
    lVar6 = lVar6 % 0x1e;
    lVar3 = lVar3 % 86400000000;
    lVar4 = lVar4 % 0x1e;
    if (lVar4 < lVar6) {
      return true;
    }
    bVar1 = lVar4 <= lVar6;
    bVar9 = SBORROW8(lVar5,lVar3);
    lVar6 = lVar5 - lVar3;
    bVar8 = lVar5 == lVar3;
  }
  return (bool)((!bVar8 && bVar9 == lVar6 < 0) & bVar1);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}